

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O0

shared_ptr<QPDFOutlineObjectHelper> __thiscall
QPDFOutlineObjectHelper::getParent(QPDFOutlineObjectHelper *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<QPDFOutlineObjectHelper> sVar2;
  QPDFOutlineObjectHelper *this_local;
  
  peVar1 = std::
           __shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x28));
  std::shared_ptr<QPDFOutlineObjectHelper>::shared_ptr
            ((shared_ptr<QPDFOutlineObjectHelper> *)this,&peVar1->parent);
  sVar2.super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFOutlineObjectHelper>)
         sVar2.super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFOutlineObjectHelper>
QPDFOutlineObjectHelper::getParent()
{
    return m->parent;
}